

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::loadoccurrence(aalcalc *this)

{
  FILE *__stream;
  undefined1 local_3c [8];
  occurrence occ_1;
  occurrence_granular occ;
  FILE *fin;
  int granular_date;
  int date_opts;
  aalcalc *this_local;
  
  fin._0_4_ = 0;
  _granular_date = this;
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: cannot open %s\n","loadoccurrence","input/occurrence.bin");
    exit(-1);
  }
  fread((void *)((long)&fin + 4),4,1,__stream);
  fin._0_4_ = fin._4_4_ >> 1;
  if ((int)fin == 0) {
    loadoccurrence<occurrence>(this,(occurrence *)local_3c,(FILE *)__stream);
  }
  else {
    loadoccurrence<occurrence_granular>
              (this,(occurrence_granular *)&occ_1.period_no,(FILE *)__stream);
  }
  return;
}

Assistant:

void aalcalc::loadoccurrence()
{

	int date_opts;
	int granular_date = 0;
	FILE *fin = fopen(OCCURRENCE_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, OCCURRENCE_FILE);
		exit(-1);
	}
	fread(&date_opts, sizeof(date_opts), 1, fin);
	granular_date = date_opts >> 1;
	if (granular_date) {
		occurrence_granular occ;
		loadoccurrence(occ, fin);
	} else {
		occurrence occ;
		loadoccurrence(occ, fin);
	}

}